

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatSkill.cpp
# Opt level: O0

void Handlers::StatSkill_Add(Character *character,PacketReader *reader)

{
  World *pWVar1;
  bool bVar2;
  bool bVar3;
  unsigned_short uVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  mapped_type *pmVar8;
  pointer pCVar9;
  _Self local_d0;
  _Self local_c8;
  iterator spell;
  key_type local_b8;
  allocator<char> local_81;
  key_type local_80;
  undefined4 local_5c;
  undefined1 local_58 [8];
  PacketBuilder reply;
  int stat_id;
  TrainType action;
  int *stat;
  PacketReader *reader_local;
  Character *character_local;
  
  reply.add_size._7_1_ = PacketReader::GetChar(reader);
  uVar4 = PacketReader::GetShort(reader);
  reply.add_size._0_4_ = (uint)uVar4;
  PacketBuilder::PacketBuilder((PacketBuilder *)local_58,PACKET_F_INIT,PACKET_A_INIT,0);
  if (reply.add_size._7_1_ == '\x01') {
    if (character->statpoints < 1) {
      local_5c = 1;
      goto LAB_001c79f4;
    }
    switch((uint)reply.add_size) {
    case 1:
      _stat_id = &character->str;
      break;
    case 2:
      _stat_id = &character->intl;
      break;
    case 3:
      _stat_id = &character->wis;
      break;
    case 4:
      _stat_id = &character->agi;
      break;
    case 5:
      _stat_id = &character->con;
      break;
    case 6:
      _stat_id = &character->cha;
      break;
    default:
      local_5c = 1;
      goto LAB_001c79f4;
    }
    iVar7 = *_stat_id;
    pWVar1 = character->world;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"MaxStat",&local_81);
    pmVar8 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
             ::operator[](&(pWVar1->config).
                           super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                          ,&local_80);
    iVar6 = util::variant::operator_cast_to_int(pmVar8);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    if (iVar6 <= iVar7) {
      local_5c = 1;
      goto LAB_001c79f4;
    }
    *_stat_id = *_stat_id + 1;
    character->statpoints = character->statpoints + -1;
    Character::CalculateStats(character,true);
    PacketBuilder::SetID((PacketBuilder *)local_58,PACKET_STATSKILL,PACKET_PLAYER);
    PacketBuilder::ReserveMore((PacketBuilder *)local_58,0x20);
    PacketBuilder::AddShort((PacketBuilder *)local_58,character->statpoints);
    PacketBuilder::AddShort((PacketBuilder *)local_58,*character->display_str);
    PacketBuilder::AddShort((PacketBuilder *)local_58,*character->display_intl);
    PacketBuilder::AddShort((PacketBuilder *)local_58,*character->display_wis);
    PacketBuilder::AddShort((PacketBuilder *)local_58,*character->display_agi);
    PacketBuilder::AddShort((PacketBuilder *)local_58,*character->display_con);
    PacketBuilder::AddShort((PacketBuilder *)local_58,*character->display_cha);
    PacketBuilder::AddShort((PacketBuilder *)local_58,character->maxhp);
    PacketBuilder::AddShort((PacketBuilder *)local_58,character->maxtp);
    PacketBuilder::AddShort((PacketBuilder *)local_58,character->maxsp);
    PacketBuilder::AddShort((PacketBuilder *)local_58,character->maxweight);
    PacketBuilder::AddShort((PacketBuilder *)local_58,character->mindam);
    PacketBuilder::AddShort((PacketBuilder *)local_58,character->maxdam);
    PacketBuilder::AddShort((PacketBuilder *)local_58,character->accuracy);
    PacketBuilder::AddShort((PacketBuilder *)local_58,character->evade);
    PacketBuilder::AddShort((PacketBuilder *)local_58,character->armor);
    Character::Send(character,(PacketBuilder *)local_58);
  }
  else if (reply.add_size._7_1_ == '\x02') {
    spell._M_node._6_1_ = 0;
    spell._M_node._5_1_ = 0;
    bVar3 = true;
    if (0 < character->skillpoints) {
      bVar2 = Character::HasSpell(character,(short)reply.add_size);
      bVar3 = true;
      if (bVar2) {
        sVar5 = Character::SpellLevel(character,(short)reply.add_size);
        pWVar1 = character->world;
        std::allocator<char>::allocator();
        spell._M_node._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"MaxSkillLevel",(allocator<char> *)((long)&spell._M_node + 7)
                  );
        spell._M_node._5_1_ = 1;
        pmVar8 = std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                 ::operator[](&(pWVar1->config).
                               super_unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>_>
                              ,&local_b8);
        iVar7 = util::variant::operator_cast_to_int(pmVar8);
        bVar3 = iVar7 <= sVar5;
      }
    }
    if ((spell._M_node._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_b8);
    }
    if ((spell._M_node._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)((long)&spell._M_node + 7));
    }
    if (bVar3) {
      local_5c = 1;
      goto LAB_001c79f4;
    }
    local_c8._M_node =
         (_List_node_base *)
         std::begin<std::__cxx11::list<Character_Spell,std::allocator<Character_Spell>>>
                   (&character->spells);
    while( true ) {
      local_d0._M_node =
           (_List_node_base *)
           std::end<std::__cxx11::list<Character_Spell,std::allocator<Character_Spell>>>
                     (&character->spells);
      bVar3 = std::operator!=(&local_c8,&local_d0);
      if (!bVar3) break;
      pCVar9 = std::_List_iterator<Character_Spell>::operator->(&local_c8);
      if ((int)pCVar9->id == (uint)reply.add_size) {
        pCVar9 = std::_List_iterator<Character_Spell>::operator->(&local_c8);
        pCVar9->level = pCVar9->level + '\x01';
        character->skillpoints = character->skillpoints + -1;
        PacketBuilder::SetID((PacketBuilder *)local_58,PACKET_STATSKILL,PACKET_ACCEPT);
        PacketBuilder::ReserveMore((PacketBuilder *)local_58,6);
        PacketBuilder::AddShort((PacketBuilder *)local_58,character->skillpoints);
        PacketBuilder::AddShort((PacketBuilder *)local_58,(uint)reply.add_size);
        pCVar9 = std::_List_iterator<Character_Spell>::operator->(&local_c8);
        PacketBuilder::AddShort((PacketBuilder *)local_58,(uint)pCVar9->level);
        Character::Send(character,(PacketBuilder *)local_58);
      }
      std::_List_iterator<Character_Spell>::operator++(&local_c8);
    }
  }
  local_5c = 0;
LAB_001c79f4:
  PacketBuilder::~PacketBuilder((PacketBuilder *)local_58);
  return;
}

Assistant:

void StatSkill_Add(Character *character, PacketReader &reader)
{
	int *stat;
	TrainType action = TrainType(reader.GetChar());
	int stat_id = reader.GetShort();

	PacketBuilder reply;

	switch (action)
	{
		case TRAIN_STAT:
			if (character->statpoints <= 0)
				return;

			switch (stat_id)
			{
				case 1: stat = &character->str; break;
				case 2: stat = &character->intl; break;
				case 3: stat = &character->wis; break;
				case 4: stat = &character->agi; break;
				case 5: stat = &character->con; break;
				case 6: stat = &character->cha; break;
				default: return;
			}

			if (*stat >= int(character->world->config["MaxStat"]))
				return;

			++(*stat);
			--character->statpoints;

			character->CalculateStats();

			reply.SetID(PACKET_STATSKILL, PACKET_PLAYER);
			reply.ReserveMore(32);
			reply.AddShort(character->statpoints);
			reply.AddShort(character->display_str);
			reply.AddShort(character->display_intl);
			reply.AddShort(character->display_wis);
			reply.AddShort(character->display_agi);
			reply.AddShort(character->display_con);
			reply.AddShort(character->display_cha);
			reply.AddShort(character->maxhp);
			reply.AddShort(character->maxtp);
			reply.AddShort(character->maxsp);
			reply.AddShort(character->maxweight);
			reply.AddShort(character->mindam);
			reply.AddShort(character->maxdam);
			reply.AddShort(character->accuracy);
			reply.AddShort(character->evade);
			reply.AddShort(character->armor);

			character->Send(reply);

			break;

		case TRAIN_SKILL:
			if (character->skillpoints <= 0 || !character->HasSpell(stat_id)
			 || character->SpellLevel(stat_id) >= int(character->world->config["MaxSkillLevel"]))
			{
				return;
			}

			UTIL_IFOREACH(character->spells, spell)
			{
				if (spell->id == stat_id)
				{
					++spell->level;
					--character->skillpoints;

					reply.SetID(PACKET_STATSKILL, PACKET_ACCEPT);
					reply.ReserveMore(6);
					reply.AddShort(character->skillpoints);
					reply.AddShort(stat_id);
					reply.AddShort(spell->level);
					character->Send(reply);
				}
			}

			break;
	}
}